

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void new_localvar(LexState *ls,TString *name)

{
  FuncState *fs_00;
  Dyndata *pDVar1;
  GCObject *o;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  GCObject *pGVar4;
  Vardesc *block;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  short sVar10;
  ulong uVar11;
  FuncState *fs;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  fs_00 = ls->fs;
  pDVar1 = ls->dyd;
  o = (GCObject *)fs_00->f;
  iVar6 = (o->p).sizelocvars;
  if (fs_00->nlocvars < iVar6) {
    pGVar4 = (o->h).gclist;
  }
  else {
    pGVar4 = (GCObject *)
             luaM_growaux_(ls->L,(o->h).gclist,&(o->p).sizelocvars,0x10,0x7fff,"local variables");
    (o->h).gclist = pGVar4;
    auVar3 = _DAT_0011d020;
    auVar2 = _DAT_0011d010;
    if (iVar6 < (o->p).sizelocvars) {
      lVar7 = (long)(o->p).sizelocvars - (long)iVar6;
      lVar8 = lVar7 + -1;
      auVar12._8_4_ = (int)lVar8;
      auVar12._0_8_ = lVar8;
      auVar12._12_4_ = (int)((ulong)lVar8 >> 0x20);
      puVar9 = (undefined8 *)((long)pGVar4 + (long)iVar6 * 0x10 + 0x10);
      uVar11 = 0;
      auVar12 = auVar12 ^ _DAT_0011d020;
      do {
        auVar13._8_4_ = (int)uVar11;
        auVar13._0_8_ = uVar11;
        auVar13._12_4_ = (int)(uVar11 >> 0x20);
        auVar13 = (auVar13 | auVar2) ^ auVar3;
        if ((bool)(~(auVar13._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar13._0_4_ ||
                    auVar12._4_4_ < auVar13._4_4_) & 1)) {
          puVar9[-2] = 0;
        }
        if ((auVar13._12_4_ != auVar12._12_4_ || auVar13._8_4_ <= auVar12._8_4_) &&
            auVar13._12_4_ <= auVar12._12_4_) {
          *puVar9 = 0;
        }
        uVar11 = uVar11 + 2;
        puVar9 = puVar9 + 4;
      } while ((lVar7 + 1U & 0xfffffffffffffffe) != uVar11);
    }
  }
  sVar10 = fs_00->nlocvars;
  *(TString **)((long)pGVar4 + (long)sVar10 * 0x10) = name;
  if ((((name->tsv).marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
    luaC_barrier_(ls->L,o,(GCObject *)name);
    sVar10 = fs_00->nlocvars;
  }
  fs_00->nlocvars = sVar10 + 1;
  iVar5 = (pDVar1->actvar).n;
  iVar6 = iVar5 + 1;
  if (iVar6 - fs_00->firstlocal < 0xc9) {
    block = (pDVar1->actvar).arr;
    if ((pDVar1->actvar).size < iVar5 + 2) {
      block = (Vardesc *)
              luaM_growaux_(ls->L,block,&(pDVar1->actvar).size,2,0x7ffffffd,"local variables");
      (pDVar1->actvar).arr = block;
      iVar5 = (pDVar1->actvar).n;
      iVar6 = iVar5 + 1;
    }
    (pDVar1->actvar).n = iVar6;
    block[iVar5].idx = sVar10;
    return;
  }
  errorlimit(fs_00,200,"local variables");
}

Assistant:

static void new_localvar (LexState *ls, TString *name) {
  FuncState *fs = ls->fs;
  Dyndata *dyd = ls->dyd;
  int reg = registerlocalvar(ls, name);
  checklimit(fs, dyd->actvar.n + 1 - fs->firstlocal,
                  MAXVARS, "local variables");
  luaM_growvector(ls->L, dyd->actvar.arr, dyd->actvar.n + 1,
                  dyd->actvar.size, Vardesc, MAX_INT, "local variables");
  dyd->actvar.arr[dyd->actvar.n++].idx = cast(short, reg);
}